

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  OfType OVar1;
  int iVar2;
  bool _printInfoMessages;
  undefined1 local_c0 [8];
  AssertionPrinter printer;
  
  iVar2 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[7])();
  _printInfoMessages = true;
  if (((char)iVar2 == '\0') &&
     (((OVar1 = (_assertionStats->assertionResult).m_resultData.resultType,
       (OVar1 & FailureBit) == Ok ||
       (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)) &&
      (_printInfoMessages = false, OVar1 != Warning)))) {
    return false;
  }
  lazyPrint(this);
  AssertionPrinter::AssertionPrinter
            ((AssertionPrinter *)local_c0,(this->super_StreamingReporterBase).stream,_assertionStats
             ,_printInfoMessages);
  AssertionPrinter::print((AssertionPrinter *)local_c0);
  std::endl<char,std::char_traits<char>>((this->super_StreamingReporterBase).stream);
  AssertionPrinter::~AssertionPrinter((AssertionPrinter *)local_c0);
  return true;
}

Assistant:

virtual bool assertionEnded( AssertionStats const& _assertionStats ) CATCH_OVERRIDE {
            AssertionResult const& result = _assertionStats.assertionResult;

            bool printInfoMessages = true;

            // Drop out if result was successful and we're not printing those
            if( !m_config->includeSuccessfulResults() && result.isOk() ) {
                if( result.getResultType() != ResultWas::Warning )
                    return false;
                printInfoMessages = false;
            }

            lazyPrint();

            AssertionPrinter printer( stream, _assertionStats, printInfoMessages );
            printer.print();
            stream << std::endl;
            return true;
        }